

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O1

void lafe_setprogname(char *name,char *defaultname)

{
  char *pcVar1;
  
  if (name != (char *)0x0) {
    defaultname = name;
  }
  pcVar1 = strrchr(defaultname,0x2f);
  lafe_progname = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    lafe_progname = defaultname;
  }
  return;
}

Assistant:

void
lafe_setprogname(const char *name, const char *defaultname)
{

	if (name == NULL)
		name = defaultname;
#if defined(_WIN32) && !defined(__CYGWIN__)
	lafe_progname = strrchr(name, '\\');
	if (strrchr(name, '/') > lafe_progname)
#endif
	lafe_progname = strrchr(name, '/');
	if (lafe_progname != NULL)
		lafe_progname++;
	else
		lafe_progname = name;
}